

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,uint16_t port,unsigned_short *eDI,Context *context)

{
  unsigned_short uVar1;
  type tVar2;
  
  uVar1 = PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
          in<unsigned_short>(&context->io,port);
  tVar2 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)1>
                    (&context->memory,ES,*eDI);
  *tVar2.target_ = uVar1;
  *eDI = *eDI + (short)(context->flags).direction_ * 2;
  return;
}

Assistant:

void ins(
	AddressT &eCX,
	uint16_t port,
	AddressT &eDI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.memory.template access<IntT, AccessType::Write>(Source::ES, eDI) = context.io.template in<IntT>(port);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}